

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

SegmentBuilder * __thiscall
capnp::_::BuilderArena::addSegmentInternal<capnp::word_const>
          (BuilderArena *this,ArrayPtr<const_capnp::word> content)

{
  MultiSegmentState *this_00;
  SegmentBuilder *pSVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar4;
  long lVar5;
  Exception *pEVar6;
  MultiSegmentState *ptrCopy;
  size_t newSize;
  ulong newSize_00;
  ulong uVar7;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar8;
  SegmentBuilder *ptrCopy_1;
  Fault f;
  Fault local_48;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *local_40;
  word *local_38;
  
  pEVar6 = (Exception *)content.size_;
  local_38 = content.ptr;
  if ((this->segment0).super_SegmentReader.arena == (Arena *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
               ,0xe6,FAILED,"segment0.getArena() != nullptr",
               "\"Can\'t allocate external segments before allocating the root segment.\"",
               (char (*) [69])
               "Can\'t allocate external segments before allocating the root segment.");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  local_48.exception = pEVar6;
  if ((Exception *)0x1fffffff < pEVar6) {
    anon_func::anon_class_8_1_89918cff::operator()((anon_class_8_1_89918cff *)&local_48);
  }
  this_00 = (this->moreSegments).ptr.ptr;
  if (this_00 == (MultiSegmentState *)0x0) {
    this_00 = (MultiSegmentState *)operator_new(0x40);
    (this_00->builders).builder.ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
    (this_00->builders).builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    (this_00->builders).builder.endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
    (this_00->builders).builder.disposer = (ArrayDisposer *)0x0;
    (this_00->forOutput).builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    (this_00->forOutput).builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    (this_00->forOutput).builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    (this_00->forOutput).builder.disposer = (ArrayDisposer *)0x0;
    (this->moreSegments).ptr.disposer =
         (Disposer *)&kj::_::HeapDisposer<capnp::_::BuilderArena::MultiSegmentState>::instance;
    (this->moreSegments).ptr.ptr = this_00;
    local_40 = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
  }
  else {
    local_40 = (this_00->builders).builder.ptr;
  }
  uVar7 = (long)(this_00->builders).builder.pos - (long)local_40;
  pSVar1 = (SegmentBuilder *)operator_new(0x38);
  (pSVar1->super_SegmentReader).arena = &this->super_Arena;
  (pSVar1->super_SegmentReader).id.value = (int)(uVar7 >> 4) + 1;
  (pSVar1->super_SegmentReader).ptr.ptr = local_38;
  (pSVar1->super_SegmentReader).ptr.size_ = (size_t)pEVar6;
  (pSVar1->super_SegmentReader).readLimiter = &this->dummyLimiter;
  pSVar1->pos = local_38 + (long)pEVar6;
  pSVar1->readOnly = true;
  pRVar8 = (this_00->builders).builder.pos;
  pRVar4 = local_40;
  if (pRVar8 == (this_00->builders).builder.endPtr) {
    newSize = 4;
    if (pRVar8 != local_40) {
      newSize = (long)pRVar8 - (long)local_40 >> 3;
    }
    kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::setCapacity(&this_00->builders,newSize);
    pRVar8 = (this_00->builders).builder.pos;
    pRVar4 = (this_00->builders).builder.ptr;
  }
  pRVar8->disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentBuilder>::instance;
  pRVar8->ptr = pSVar1;
  (this_00->builders).builder.pos = pRVar8 + 1;
  uVar7 = ((long)(pRVar8 + 1) - (long)pRVar4 >> 4) + 1;
  pAVar2 = (this_00->forOutput).builder.ptr;
  pAVar3 = (this_00->forOutput).builder.endPtr;
  lVar5 = (long)pAVar3 - (long)pAVar2;
  if ((ulong)(lVar5 >> 4) < uVar7) {
    newSize_00 = 4;
    if (pAVar3 != pAVar2) {
      newSize_00 = lVar5 >> 3;
    }
    if (newSize_00 < uVar7) {
      newSize_00 = uVar7;
    }
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::setCapacity(&this_00->forOutput,newSize_00);
    pAVar2 = (this_00->forOutput).builder.ptr;
  }
  pAVar2 = pAVar2 + uVar7;
  pAVar3 = (this_00->forOutput).builder.pos;
  if (pAVar3 < pAVar2) {
    do {
      (this_00->forOutput).builder.pos = pAVar3 + 1;
      pAVar3->ptr = (word *)0x0;
      pAVar3->size_ = 0;
      pAVar3 = (this_00->forOutput).builder.pos;
    } while (pAVar3 < pAVar2);
  }
  else {
    (this_00->forOutput).builder.pos = pAVar2;
  }
  return pSVar1;
}

Assistant:

SegmentBuilder* BuilderArena::addSegmentInternal(kj::ArrayPtr<T> content) {
  // This check should never fail in practice, since you can't get an Orphanage without allocating
  // the root segment.
  KJ_REQUIRE(segment0.getArena() != nullptr,
      "Can't allocate external segments before allocating the root segment.");

  auto contentSize = verifySegmentSize(content.size());

  MultiSegmentState* segmentState;
  KJ_IF_MAYBE(s, moreSegments) {
    segmentState = *s;
  } else {
    auto newSegmentState = kj::heap<MultiSegmentState>();
    segmentState = newSegmentState;
    moreSegments = kj::mv(newSegmentState);
  }